

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

Interpolations *
testing::internal::ValidateMatcherDescription
          (Interpolations *__return_storage_ptr__,char **param_names,char *description)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Message *pMVar4;
  char *in_RCX;
  Message local_a0;
  AssertHelper local_98;
  char *p;
  Interpolations *local_88;
  internal *local_80;
  AssertionResult gtest_ar;
  string param_name;
  
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p = description;
  local_88 = __return_storage_ptr__;
  local_80 = (internal *)description;
  while (*(char *)&((String *)description)->c_str_ != '\0') {
    bVar1 = SkipPrefix("%%",&p);
    description = p;
    if (bVar1) {
      param_name._M_dataplus._M_p = p + -2;
      param_name._M_string_length = (size_type)p;
      param_name.field_2._M_allocated_capacity._0_4_ = 0xfffffffe;
      std::
      vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>::
      emplace_back<testing::internal::Interpolation>(local_88,(Interpolation *)&param_name);
    }
    else {
      bVar1 = SkipPrefix("%(",&p);
      description = p;
      if (bVar1) {
        pcVar3 = strstr(p,")s");
        if (pcVar3 == (char *)0x0) {
          Message::Message((Message *)&gtest_ar);
          FormatMatcherDescriptionSyntaxError_abi_cxx11_
                    (&param_name,local_80,description + -2,in_RCX);
          pMVar4 = Message::operator<<((Message *)&gtest_ar,&param_name);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [38])
                                              "an interpolation must end with \")s\", ");
          pMVar4 = Message::operator<<(pMVar4,(char (*) [6])"but \"");
          local_a0.ss_ = (StrStream *)(description + -2);
          pMVar4 = Message::operator<<(pMVar4,(char **)&local_a0);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [12])"\" does not.");
          in_RCX = (char *)0x2317;
          AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                     ,0x2317,"Failed");
          AssertHelper::operator=(&local_98,pMVar4);
          AssertHelper::~AssertHelper(&local_98);
          std::__cxx11::string::~string((string *)&param_name);
          if (gtest_ar._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
        }
        else {
          param_name._M_dataplus._M_p = (pointer)&param_name.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&param_name,description,pcVar3);
          iVar2 = GetParamIndex(param_names,&param_name);
          if (iVar2 == -3) {
            Message::Message(&local_a0);
            FormatMatcherDescriptionSyntaxError_abi_cxx11_
                      ((string *)&gtest_ar,local_80,description,in_RCX);
            pMVar4 = Message::operator<<(&local_a0,(string *)&gtest_ar);
            pMVar4 = Message::operator<<(pMVar4,(char (*) [2])0x178b6e);
            pMVar4 = Message::operator<<(pMVar4,&param_name);
            pMVar4 = Message::operator<<(pMVar4,(char (*) [32])"\" is an invalid parameter name.");
            in_RCX = (char *)0x231e;
            AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                       ,0x231e,"Failed");
            AssertHelper::operator=(&local_98,pMVar4);
            AssertHelper::~AssertHelper(&local_98);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (local_a0.ss_ != (StrStream *)0x0) {
              (**(code **)(*(long *)local_a0.ss_ + 8))();
            }
          }
          else {
            gtest_ar._0_8_ = description + -2;
            description = pcVar3 + 2;
            gtest_ar.message_.ptr_ = (String *)description;
            std::
            vector<testing::internal::Interpolation,_std::allocator<testing::internal::Interpolation>_>
            ::emplace_back<testing::internal::Interpolation>(local_88,(Interpolation *)&gtest_ar);
            p = description;
          }
          std::__cxx11::string::~string((string *)&param_name);
        }
      }
      else {
        param_name._M_dataplus._M_p._0_1_ = 0x25;
        in_RCX = p;
        CmpHelperNE<char,char>((internal *)&gtest_ar,"*p","\'%\'",p,(char *)&param_name);
        if (gtest_ar.success_ == false) {
          Message::Message(&local_a0);
          FormatMatcherDescriptionSyntaxError_abi_cxx11_(&param_name,local_80,description,in_RCX);
          pMVar4 = Message::operator<<(&local_a0,&param_name);
          pMVar4 = Message::operator<<(pMVar4,(char (*) [38])
                                              "use \"%%\" instead of \"%\" to print \"%\".");
          pcVar3 = "";
          if ((gtest_ar.message_.ptr_ != (String *)0x0) &&
             (pcVar3 = (gtest_ar.message_.ptr_)->c_str_, pcVar3 == (char *)0x0)) {
            pcVar3 = "";
          }
          in_RCX = (char *)0x2327;
          AssertHelper::AssertHelper
                    (&local_98,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/MeteoSwiss-APN[P]serialbox/libs/gmock-gtest/gmock-gtest-all.cc"
                     ,8999,pcVar3);
          AssertHelper::operator=(&local_98,pMVar4);
          AssertHelper::~AssertHelper(&local_98);
          std::__cxx11::string::~string((string *)&param_name);
          if (local_a0.ss_ != (StrStream *)0x0) {
            (**(code **)(*(long *)local_a0.ss_ + 8))();
          }
        }
        scoped_ptr<testing::internal::String>::~scoped_ptr(&gtest_ar.message_);
        description = description + 1;
        p = description;
      }
    }
  }
  return local_88;
}

Assistant:

Interpolations ValidateMatcherDescription(
    const char* param_names[], const char* description) {
  Interpolations interps;
  for (const char* p = description; *p != '\0';) {
    if (SkipPrefix("%%", &p)) {
      interps.push_back(Interpolation(p - 2, p, kPercentInterpolation));
    } else if (SkipPrefix("%(", &p)) {
      const char* const q = strstr(p, ")s");
      if (q == NULL) {
        // TODO(wan@google.com): change the source file location in
        // the failure to point to where the MATCHER*() macro is used.
        ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p - 2)
                      << "an interpolation must end with \")s\", "
                      << "but \"" << (p - 2) << "\" does not.";
      } else {
        const string param_name(p, q);
        const int param_index = GetParamIndex(param_names, param_name);
        if (param_index == kInvalidInterpolation) {
          ADD_FAILURE() << FormatMatcherDescriptionSyntaxError(description, p)
                        << "\"" << param_name
                        << "\" is an invalid parameter name.";
        } else {
          interps.push_back(Interpolation(p - 2, q + 2, param_index));
          p = q + 2;
        }
      }
    } else {
      EXPECT_NE(*p, '%') << FormatMatcherDescriptionSyntaxError(description, p)
                         << "use \"%%\" instead of \"%\" to print \"%\".";
      ++p;
    }
  }
  return interps;
}